

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitcell.hpp
# Opt level: O1

size_t __thiscall lattice::unitcell::add_bond(unitcell *this,size_t s,size_t t,offset_t *os,int tp)

{
  pointer pbVar1;
  pointer pbVar2;
  ulong uVar3;
  invalid_argument *this_00;
  DenseStorage<long,__1,__1,_1,_0> local_68;
  bond_t local_58;
  
  uVar3 = ((long)(this->sites_).
                 super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->sites_).
                 super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if ((uVar3 < s || uVar3 - s == 0) || (uVar3 < t || uVar3 - t == 0)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"site index out of range");
  }
  else {
    if ((os->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
        this->dim_) {
      pbVar1 = (this->bonds_).
               super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (this->bonds_).
               super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      Eigen::DenseStorage<long,_-1,_-1,_1,_0>::DenseStorage
                (&local_68,(DenseStorage<long,__1,__1,_1,_0> *)os);
      local_58.source = s;
      local_58.target = t;
      Eigen::DenseStorage<long,_-1,_-1,_1,_0>::DenseStorage
                ((DenseStorage<long,__1,__1,_1,_0> *)&local_58.target_offset,&local_68);
      local_58.type = tp;
      std::vector<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>::
      emplace_back<lattice::unitcell::bond_t>(&this->bonds_,&local_58);
      free(local_58.target_offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      free(local_68.m_data);
      return ((long)pbVar2 - (long)pbVar1 >> 3) * -0x3333333333333333;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"unitcell offset dimension mismatch");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::size_t add_bond(std::size_t s, std::size_t t, const offset_t& os, int tp) {
    if (s >= num_sites() || t >= num_sites())
      throw std::invalid_argument("site index out of range");
    if (std::size_t(os.size()) != dimension())
      throw std::invalid_argument("unitcell offset dimension mismatch");
    std::size_t b = bonds_.size();
    bonds_.push_back(bond_t(s, t, os, tp));
    return b;
  }